

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_ConvolutionReverb.cpp
# Opt level: O0

bool ConvolutionReverb_UploadSample
               (int index,float *data,int numsamples,int numchannels,int samplerate,char *name)

{
  undefined1 auVar1 [16];
  IRSample *pIVar2;
  ulong uVar3;
  float *pfVar4;
  int num;
  IRSample *s;
  MutexScopeLock mutexScope;
  char *name_local;
  int samplerate_local;
  int numchannels_local;
  int numsamples_local;
  float *data_local;
  int index_local;
  
  if ((index < 0) || (0xf < index)) {
    data_local._7_1_ = false;
  }
  else {
    mutexScope.mutex = (Mutex *)name;
    MutexScopeLock::MutexScopeLock
              ((MutexScopeLock *)&s,(Mutex *)ConvolutionReverb::sampleMutex,true);
    pIVar2 = ConvolutionReverb::GetIRSample(index);
    if ((pIVar2->allocated != 0) && (pIVar2->data != (float *)0x0)) {
      operator_delete__(pIVar2->data);
    }
    if (numsamples * numchannels < 1) {
      pIVar2->data = (float *)0x0;
      pIVar2->allocated = 1;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(numsamples * numchannels);
      uVar3 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar3 = 0xffffffffffffffff;
      }
      pfVar4 = (float *)operator_new__(uVar3);
      pIVar2->data = pfVar4;
      pIVar2->allocated = 1;
      strcpy(pIVar2->name,(char *)mutexScope.mutex);
      memcpy(pIVar2->data,data,(long)(numsamples * numchannels) << 2);
    }
    pIVar2->numsamples = numsamples;
    pIVar2->numchannels = numchannels;
    pIVar2->samplerate = samplerate;
    ConvolutionReverb::globalupdatecount = ConvolutionReverb::globalupdatecount + 1;
    pIVar2->updatecount = ConvolutionReverb::globalupdatecount;
    data_local._7_1_ = true;
    MutexScopeLock::~MutexScopeLock((MutexScopeLock *)&s);
  }
  return data_local._7_1_;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API bool ConvolutionReverb_UploadSample(int index, float* data, int numsamples, int numchannels, int samplerate, const char* name)
{
    if (index < 0 || index >= ConvolutionReverb::MAXSAMPLE)
        return false;
    MutexScopeLock mutexScope(ConvolutionReverb::sampleMutex);
    ConvolutionReverb::IRSample& s = ConvolutionReverb::GetIRSample(index);
    if (s.allocated)
        delete[] s.data;
    int num = numsamples * numchannels;
    if (num > 0)
    {
        s.data = new float[num];
        s.allocated = 1;
        strcpy_s(s.name, name);
        memcpy(s.data, data, numsamples * numchannels * sizeof(float));
    }
    else
    {
        s.data = NULL;
        s.allocated = 1;
    }
    s.numsamples = numsamples;
    s.numchannels = numchannels;
    s.samplerate = samplerate;
    s.updatecount = ++ConvolutionReverb::globalupdatecount;
    return true;
}